

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

size_t decode_ber_length_integer(uint8_t *buf,int *decoded_integer,int param_3)

{
  byte bVar1;
  undefined4 local_30;
  undefined4 local_2c;
  int k;
  int special_length;
  int numBytes;
  int param_2_local;
  int *decoded_integer_local;
  uint8_t *buf_local;
  
  if (*buf < 0x80) {
    *decoded_integer = (uint)*buf;
    buf_local = (uint8_t *)0x1;
  }
  else {
    bVar1 = *buf;
    local_2c = 0;
    decoded_integer_local = (int *)buf;
    for (local_30 = 0; local_30 < (int)(bVar1 & 0x7f); local_30 = local_30 + 1) {
      decoded_integer_local = (int *)((long)decoded_integer_local + 1);
      local_2c = (uint)*(byte *)decoded_integer_local | local_2c << 8;
    }
    *decoded_integer = local_2c;
    buf_local = (uint8_t *)(long)(int)((bVar1 & 0x7f) + 1);
  }
  return (size_t)buf_local;
}

Assistant:

static size_t decode_ber_length_integer(const uint8_t* buf, int* decoded_integer, int){
    if(*buf <= 127) {
        *decoded_integer = *buf;
        return 1;
    } else {
        int numBytes = *buf & 0x7F;
        int special_length = 0;
        for(int k = 0; k < numBytes; k++){
            buf++;
            special_length <<= 8;
            special_length |= *buf;
        }
        *decoded_integer = special_length;
        return numBytes + 1;
    }
}